

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmp.hpp
# Opt level: O3

vector<float,_std::allocator<float>_> *
RGB2HSI(vector<float,_std::allocator<float>_> *__return_storage_ptr__,float r,float g,float b)

{
  float *pfVar1;
  __normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> __result;
  float *pfVar2;
  float *pfVar3;
  float fVar4;
  undefined4 in_XMM0_Db;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  undefined4 in_XMM1_Db;
  undefined4 in_XMM1_Dd;
  undefined1 auVar6 [16];
  undefined1 auVar8 [16];
  float fVar9;
  undefined4 in_XMM2_Db;
  float fVar10;
  double dVar11;
  float fVar12;
  float fVar13;
  initializer_list<float> __l;
  initializer_list<float> __l_00;
  vector<float,_std::allocator<float>_> rgb;
  allocator_type local_8d;
  float local_8c;
  undefined8 local_88;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  float local_78;
  undefined4 uStack_74;
  undefined4 uStack_6c;
  float local_68;
  undefined4 uStack_64;
  vector<float,_std::allocator<float>_> local_50;
  float local_38;
  undefined4 uStack_34;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  float local_1c;
  float local_18;
  float local_14;
  undefined1 auVar5 [16];
  undefined1 auVar7 [16];
  
  local_88 = (double)CONCAT44(in_XMM0_Db,r);
  __l._M_len = 3;
  __l._M_array = &local_1c;
  uStack_80 = in_XMM0_Dc;
  uStack_7c = in_XMM0_Dd;
  local_78 = g;
  uStack_74 = in_XMM1_Db;
  uStack_6c = in_XMM1_Dd;
  local_68 = b;
  uStack_64 = in_XMM2_Db;
  local_1c = r;
  local_18 = g;
  local_14 = b;
  std::vector<float,_std::allocator<float>_>::vector(&local_50,__l,&local_8d);
  pfVar3 = local_50.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start + 1;
  pfVar2 = local_50.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pfVar3 != local_50.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_finish &&
      local_50.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_50.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    fVar4 = *local_50.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      fVar13 = *pfVar3;
      pfVar1 = pfVar3;
      if (fVar4 <= *pfVar3) {
        fVar13 = fVar4;
        pfVar1 = pfVar2;
      }
      pfVar2 = pfVar1;
      fVar4 = fVar13;
      pfVar3 = pfVar3 + 1;
    } while (pfVar3 != local_50.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_finish);
  }
  fVar12 = (float)local_88 + local_78 + local_68;
  fVar13 = fVar12 / 3.0;
  fVar4 = 0.0;
  fVar9 = 0.0;
  if (0.0 < fVar13) {
    fVar9 = 1.0 - *pfVar2 / fVar13;
  }
  fVar10 = 0.0;
  if (1e-08 <= fVar9) {
    fVar10 = fVar9;
  }
  if (0.0 < fVar10) {
    auVar6._4_4_ = uStack_74;
    auVar6._0_4_ = local_78;
    auVar6._8_4_ = uStack_74;
    auVar6._12_4_ = uStack_6c;
    auVar5._8_8_ = auVar6._8_8_;
    auVar5._4_4_ = local_68;
    auVar5._0_4_ = local_78;
    auVar7._0_12_ = auVar5._0_12_;
    auVar7._12_4_ = uStack_64;
    auVar8._4_4_ = fVar12;
    auVar8._0_4_ = fVar12;
    auVar8._8_4_ = fVar12;
    auVar8._12_4_ = fVar12;
    auVar8 = divps(auVar7,auVar8);
    fVar4 = (float)local_88 / fVar12 - auVar8._0_4_;
    fVar9 = (float)local_88 / fVar12 - auVar8._4_4_;
    dVar11 = (double)(fVar4 + fVar9) * 0.5;
    fVar4 = fVar4 * fVar4 + (auVar8._0_4_ - auVar8._4_4_) * fVar9;
    uStack_34 = local_88._4_4_;
    uStack_30 = uStack_80;
    uStack_2c = uStack_7c;
    local_8c = fVar10;
    local_38 = fVar13;
    if (fVar4 < 0.0) {
      local_88 = dVar11;
      fVar4 = sqrtf(fVar4);
      dVar11 = local_88;
    }
    else {
      fVar4 = SQRT(fVar4);
    }
    dVar11 = acos(dVar11 / (double)fVar4);
    fVar4 = (float)dVar11;
    fVar13 = local_38;
    fVar10 = local_8c;
    if (local_78 < local_68) {
      fVar4 = 6.2831855 - fVar4;
    }
  }
  __l_00._M_len = 3;
  __l_00._M_array = &local_1c;
  local_1c = fVar4;
  local_18 = fVar10;
  local_14 = fVar13;
  std::vector<float,_std::allocator<float>_>::vector(__return_storage_ptr__,__l_00,&local_8d);
  if (local_50.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (float *)0x0) {
    operator_delete(local_50.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_50.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_50.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::vector<float> RGB2HSI(float r, float g, float b) {
    auto rgb = std::vector<float>({r, g, b});
    auto min = std::min_element(rgb.begin(), rgb.end());

    float h = 0;
    float s = 0;
    float i = (r + g + b) / 3;

    float rn = r / (r + g + b);
    float gn = g / (r + g + b);
    float bn = b / (r + g + b);

    if (i > 0) s = 1 - (rgb[std::distance(rgb.begin(), min)] / i);
    if (s < 1e-8) s = 0;
    if (s > 0) {
        h = acos((0.5 * ((rn - gn) + (rn - bn))) / (std::sqrt((rn - gn) * (rn - gn) + (rn - bn) * (gn - bn))));
        if (b > g) h = 2 * M_PI - h;
    }
    return {h, s, i};
}